

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O1

void create_hacked_option_button(void)

{
  ushort uVar1;
  undefined8 uVar2;
  Am_Wrapper *pAVar3;
  Am_Value_List *this;
  Am_Object *pAVar4;
  Am_Constraint *pAVar5;
  Am_Object AVar6;
  ulong uVar7;
  Am_Object option3;
  Am_Object option4;
  Am_Object menu_fade_group4;
  Am_Object menu_fade_group3;
  Am_Object option2;
  Am_Object menu_fade_group2;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78 [2];
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object::Create((char *)&local_68);
  uVar1 = Am_Object::Set((ushort)&local_68,100,0);
  uVar1 = Am_Object::Set(uVar1,0x65,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_78);
  uVar2 = Am_Value_List::Add(local_78,"Option Menu First item",1,1);
  uVar2 = Am_Value_List::Add(uVar2,"Another menu item",1,1);
  Am_Object::Create((char *)&local_98);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
  uVar2 = Am_Value_List::Add(uVar2,pAVar3,1,1);
  uVar2 = Am_Value_List::Add(uVar2,"Not active",1,1);
  uVar2 = Am_Value_List::Add(uVar2,"Item 4",1,1);
  uVar2 = Am_Value_List::Add(uVar2,"Item 5",1,1);
  this = (Am_Value_List *)Am_Value_List::Add(uVar2,"Last item",1,1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::operator=(&menu,pAVar4);
  Am_Object::~Am_Object(&local_98);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_78);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Create((char *)local_78);
  uVar1 = Am_Object::Set((ushort)local_78,true,0);
  uVar1 = Am_Object::Set(uVar1,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,0xfa);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)width_of_menu);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar5);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,true,0);
  Am_Object::operator=(&option_button,pAVar4);
  Am_Object::~Am_Object(local_78);
  Am_Object::Get_Object((ushort)local_78,0x10f5c8);
  Am_Object::Set((ushort)local_78,true,0);
  Am_Object::~Am_Object(local_78);
  Am_Object::Create((char *)local_78);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&option_button);
  uVar1 = Am_Object::Add((ushort)local_78,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)button_left_m2);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x64,(ulong)pAVar5);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)button_top_p_28);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar1 = Am_Object::Set(uVar1,true,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)width_of_menu);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar5);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar5);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x169,0);
  Am_Object::operator=(&menu_fade_group,pAVar4);
  Am_Object::~Am_Object(local_78);
  Am_Object::Get_Object((ushort)local_78,0x10f5c8);
  uVar1 = Am_Object::Set((ushort)local_78,(char *)0x150,0x10b27f);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&menu_fade_group);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pop_up_sub_menu.from_wrapper);
  Am_Object::~Am_Object(local_78);
  Am_Object::Get_Object((ushort)local_78,0x10f6c8);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&option_button);
  uVar1 = Am_Object::Add((ushort)local_78,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pop_down_sub_menu.from_wrapper);
  Am_Object::~Am_Object(local_78);
  Am_Object::Am_Object(&local_18,&menu);
  Am_Object::Add_Part(0xf6c0,(Am_Object)0x1d2,(ulong)&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Am_Object(&local_20,&option_button);
  AVar6.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x10f4e8,SUB81(&local_20,0),1);
  Am_Object::Am_Object(&local_28,&menu_fade_group);
  Am_Object::Add_Part(AVar6,SUB81(&local_28,0),1);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Copy((char *)&local_68);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_68,100,0xdc);
  Am_Object::Am_Object(local_78,pAVar4);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Copy((char *)&local_98);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_78);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_98,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::Am_Object(&local_68,pAVar4);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Get_Object((ushort)&local_80,(ulong)&local_68);
  Am_Object::Get_Object((ushort)&local_98,(ulong)&local_80);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(local_78);
  Am_Object::Set((ushort)&local_98,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_80);
  Am_Object::Get_Object((ushort)&local_98,(ulong)local_78);
  uVar1 = Am_Object::Set((ushort)&local_98,(char *)0x150,0x10b287);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pop_up_sub_menu.from_wrapper);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Am_Object(&local_30,local_78);
  AVar6.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x10f4e8,SUB81(&local_30,0),1);
  Am_Object::Am_Object(&local_38,&local_68);
  Am_Object::Add_Part(AVar6,SUB81(&local_38,0),1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Copy((char *)&local_80);
  uVar1 = Am_Object::Set((ushort)&local_80,100,0xdc);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x65,0x4b);
  Am_Object::Am_Object(&local_98,pAVar4);
  Am_Object::~Am_Object(&local_80);
  Am_Object::Copy((char *)&local_90);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_90,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::Am_Object(&local_80,pAVar4);
  Am_Object::~Am_Object(&local_90);
  Am_Object::Get_Object((ushort)&local_88,(ulong)&local_80);
  Am_Object::Get_Object((ushort)&local_90,(ulong)&local_88);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
  Am_Object::Set((ushort)&local_90,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Get_Object((ushort)&local_90,(ulong)&local_98);
  uVar1 = Am_Object::Set((ushort)&local_90,(char *)0x150,0x10b294);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pop_up_sub_menu.from_wrapper);
  Am_Object::~Am_Object(&local_90);
  Am_Object::Am_Object(&local_40,&local_98);
  AVar6.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x10f4e8,SUB81(&local_40,0),1);
  Am_Object::Am_Object(&local_48,&local_80);
  Am_Object::Add_Part(AVar6,SUB81(&local_48,0),1);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Copy((char *)&local_88);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_88,100,0x1ae);
  Am_Object::Am_Object(&local_90,pAVar4);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Copy((char *)&local_a0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_a0,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::Am_Object(&local_88,pAVar4);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Get_Object((ushort)&local_50,(ulong)&local_88);
  Am_Object::Get_Object((ushort)&local_a0,(ulong)&local_50);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
  Am_Object::Set((ushort)&local_a0,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Get_Object((ushort)&local_a0,(ulong)&local_90);
  uVar1 = Am_Object::Set((ushort)&local_a0,(char *)0x150,0x10b2a0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_88);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pop_up_sub_menu.from_wrapper);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Am_Object(&local_58,&local_90);
  AVar6.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x10f4e8,SUB81(&local_58,0),1);
  Am_Object::Am_Object(&local_60,&local_88);
  Am_Object::Add_Part(AVar6,SUB81(&local_60,0),1);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Create((char *)&local_a0);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_a0,true,1);
  pAVar4 = (Am_Object *)Am_Object::operator=(&optionvisibleanimation,pAVar4);
  uVar7 = Am_Animate_With(pAVar4);
  Am_Object::Set(0xf6c0,(Am_Constraint *)0x69,uVar7);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Create((char *)&local_a0);
  uVar1 = Am_Object::Set((ushort)&local_a0,(Am_Value *)0x64,(ulong)&Am_No_Value);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x65,0xfffffc18);
  uVar7 = Am_Animate_With(pAVar4);
  Am_Object::Set((ushort)&local_68,(Am_Constraint *)0x69,uVar7);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Create((char *)&local_a0);
  uVar7 = Am_Animate_With(&local_a0);
  Am_Object::Set((ushort)&local_80,(Am_Constraint *)0x69,uVar7);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Create((char *)&local_a0);
  uVar1 = Am_Object::Set((ushort)&local_a0,(Am_Value *)0x64,(ulong)&Am_No_Value);
  uVar1 = Am_Object::Set(uVar1,(Am_Value *)0x65,(ulong)&Am_No_Value);
  uVar1 = Am_Object::Set(uVar1,(Am_Value *)0x66,(ulong)&Am_No_Value);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x67,1);
  uVar7 = Am_Animate_With(pAVar4);
  Am_Object::Set((ushort)&local_88,(Am_Constraint *)0x69,uVar7);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(local_78);
  return;
}

Assistant:

void
create_hacked_option_button()
{
  menu =
      Am_Menu.Create("my_option_menu")
          .Set(Am_LEFT, 0)
          .Set(Am_TOP, 0)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add("Option Menu First item")
                             .Add("Another menu item")
                             .Add(Am_Menu_Line_Command.Create("my menu line"))
                             .Add("Not active")
                             .Add("Item 4")
                             .Add("Item 5")
                             .Add("Last item"));
  option_button = Am_Button.Create("pretent_option_button")
                      .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
                      .Set(Am_LEFT, 10)
                      .Set(Am_TOP, 250)
                      .Set(Am_WIDTH, width_of_menu)
                      .Set(Am_LEAVE_ROOM_FOR_FRINGE, false);
  option_button.Get_Object(Am_INTERACTOR).Set(Am_CONTINUOUS, false);
  menu_fade_group = Am_Fade_Group.Create("menu_Fade_Group")
                        .Add(Am_FOR_ITEM, option_button)
                        .Set(Am_LEFT, button_left_m2)
                        .Set(Am_TOP, button_top_p_28)
                        .Set(Am_VISIBLE, false)
                        .Set(Am_WIDTH, width_of_menu)
                        .Set(Am_HEIGHT, Am_Height_Of_Parts)
                        .Set(Am_VALUE, 0);
  option_button.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Push me")
      .Set(Am_SUB_MENU, menu_fade_group, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  menu.Get_Object(Am_COMMAND)
      .Add(Am_FOR_ITEM, option_button)
      .Set(Am_DO_METHOD, pop_down_sub_menu);
  menu_fade_group.Add_Part(Am_SUB_MENU, menu);
  fade_group.Add_Part(option_button).Add_Part(menu_fade_group);

  Am_Object option2 = option_button.Copy().Set(Am_LEFT, 220);
  Am_Object menu_fade_group2 = menu_fade_group.Copy().Set(Am_FOR_ITEM, option2);
  menu_fade_group2.Get_Object(Am_SUB_MENU)
      .Get_Object(Am_COMMAND)
      .Set(Am_FOR_ITEM, option2);
  option2.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Push me also")
      .Set(Am_SUB_MENU, menu_fade_group2, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  fade_group.Add_Part(option2).Add_Part(menu_fade_group2);

  Am_Object option3 = option_button.Copy().Set(Am_LEFT, 220).Set(Am_TOP, 75);
  Am_Object menu_fade_group3 = menu_fade_group.Copy().Set(Am_FOR_ITEM, option3);
  menu_fade_group3.Get_Object(Am_SUB_MENU)
      .Get_Object(Am_COMMAND)
      .Set(Am_FOR_ITEM, option3);
  option3.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Push me too")
      .Set(Am_SUB_MENU, menu_fade_group3, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  fade_group.Add_Part(option3).Add_Part(menu_fade_group3);

  Am_Object option4 = option_button.Copy().Set(Am_LEFT, 430);
  Am_Object menu_fade_group4 = menu_fade_group.Copy().Set(Am_FOR_ITEM, option4);
  menu_fade_group4.Get_Object(Am_SUB_MENU)
      .Get_Object(Am_COMMAND)
      .Set(Am_FOR_ITEM, option4);
  option4.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Another Push Me")
      .Set(Am_SUB_MENU, menu_fade_group4, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  fade_group.Add_Part(option4).Add_Part(menu_fade_group4);

  menu_fade_group.Set(
      Am_VISIBLE, Am_Animate_With(optionvisibleanimation =
                                      Am_Visible_Animator.Create("fade_menu")
                                          .Set(Am_USE_FADING, true)));

  menu_fade_group2.Set(
      Am_VISIBLE, Am_Animate_With(Am_Visible_Animator.Create("fly_sub_menu")
                                      .Set(Am_LEFT, Am_No_Value)
                                      .Set(Am_TOP, -1000)));
  menu_fade_group3.Set(Am_VISIBLE, Am_Animate_With(Am_Fly_Apart_Animator.Create(
                                       "fly_apart_sub_menu")));
  menu_fade_group4.Set(
      Am_VISIBLE, Am_Animate_With(Am_Visible_Animator.Create("grow_sub_menu")
                                      .Set(Am_LEFT, Am_No_Value)
                                      .Set(Am_TOP, Am_No_Value)
                                      .Set(Am_WIDTH, Am_No_Value)
                                      .Set(Am_HEIGHT, 1)));
}